

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void handle_D_option(char *z)

{
  option_type oVar1;
  char *__s1;
  code *pcVar2;
  int iVar3;
  char **ppcVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  FILE *extraout_RDX;
  s_options *psVar8;
  FILE *__stream;
  char *pcVar9;
  char **__s;
  long lVar10;
  int iVar11;
  int n;
  long lVar12;
  double dVar13;
  char *pcStack_80;
  FILE *pFStack_78;
  double dStack_70;
  char **ppcStack_68;
  char **ppcStack_60;
  long lStack_58;
  
  lVar10 = (long)nDefine;
  nDefine = nDefine + 1;
  psVar8 = (s_options *)(lVar10 * 8 + 8);
  ppcVar4 = (char **)realloc(azDefine,(size_t)psVar8);
  if (ppcVar4 == (char **)0x0) {
    __s = azDefine;
    azDefine = ppcVar4;
    handle_D_option_cold_2();
  }
  else {
    azDefine = ppcVar4;
    sVar5 = strlen(z);
    __s = (char **)(long)((int)sVar5 + 1);
    pcVar6 = (char *)malloc((size_t)__s);
    ppcVar4[lVar10] = pcVar6;
    if (pcVar6 != (char *)0x0) {
      strcpy(pcVar6,z);
      for (; (*pcVar6 != '\0' && (*pcVar6 != '=')); pcVar6 = pcVar6 + 1) {
      }
      *pcVar6 = '\0';
      return;
    }
  }
  handle_D_option_cold_1();
  sVar5 = strlen((char *)__s);
  ppcVar4 = (char **)(long)((int)sVar5 + 1);
  user_templatename = (char *)malloc((size_t)ppcVar4);
  if (user_templatename != (char *)0x0) {
    strcpy(user_templatename,(char *)__s);
    return;
  }
  handle_T_option_cold_1();
  argv = ppcVar4;
  op = psVar8;
  errstream = (FILE *)extraout_RDX;
  if ((((ppcVar4 != (char **)0x0) && (psVar8 != (s_options *)0x0)) && (*ppcVar4 != (char *)0x0)) &&
     (pcVar6 = ppcVar4[1], pcVar6 != (char *)0x0)) {
    lVar12 = 1;
    iVar11 = 0;
    __stream = extraout_RDX;
    pFStack_78 = extraout_RDX;
    ppcStack_68 = ppcVar4;
    ppcStack_60 = __s;
    lStack_58 = lVar10;
    do {
      ppcVar4 = argv;
      n = (int)lVar12;
      if ((*pcVar6 == '-') || (*pcVar6 == '+')) {
        pcVar6 = op->label;
        if (pcVar6 != (char *)0x0) {
          pcVar9 = argv[lVar12];
          psVar8 = op;
          do {
            sVar5 = strlen(pcVar6);
            iVar3 = strncmp(pcVar9 + 1,pcVar6,(long)(int)sVar5);
            if (iVar3 == 0) {
              if (psVar8->label != (char *)0x0) {
                pcVar2 = (code *)psVar8->arg;
                iVar3 = 0;
                if (pcVar2 == (code *)0x0) goto LAB_00106122;
                oVar1 = psVar8->type;
                if (oVar1 == OPT_FSTR) {
                  (*pcVar2)(pcVar9 + 2);
                  goto LAB_00106122;
                }
                if (oVar1 == OPT_FFLAG) {
                  (*pcVar2)();
                  goto LAB_00106122;
                }
                if (oVar1 == OPT_FLAG) {
                  *(uint *)pcVar2 = (uint)(*pcVar9 == '-');
                  goto LAB_00106122;
                }
                if (__stream == (FILE *)0x0) goto LAB_0010611d;
                pcVar6 = "%smissing argument on switch.\n";
                goto LAB_00105f42;
              }
              break;
            }
            pcVar6 = psVar8[1].label;
            psVar8 = psVar8 + 1;
          } while (pcVar6 != (char *)0x0);
        }
        if (__stream == (FILE *)0x0) {
LAB_0010611d:
          iVar3 = 1;
        }
        else {
          pcVar6 = "%sundefined option.\n";
LAB_00105f42:
          fprintf(__stream,pcVar6,emsg);
          iVar3 = 1;
          errline(n,1,(FILE *)__stream);
        }
LAB_00106122:
        iVar11 = iVar11 + iVar3;
      }
      else {
        pcVar6 = strchr(pcVar6,0x3d);
        if (pcVar6 != (char *)0x0) {
          pcVar6 = strchr(ppcVar4[lVar12],0x3d);
          if (pcVar6 == (char *)0x0) {
            __assert_fail("cp!=0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                          ,0x78a,"int handleswitch(int, FILE *)");
          }
          *pcVar6 = '\0';
          psVar8 = op;
          pcVar9 = op->label;
          if (pcVar9 == (char *)0x0) {
            lVar10 = 0;
          }
          else {
            __s1 = ppcVar4[lVar12];
            ppcVar4 = &op[1].label;
            lVar10 = 0;
            do {
              iVar3 = strcmp(__s1,pcVar9);
              if (iVar3 == 0) break;
              lVar10 = lVar10 + 1;
              pcVar9 = *ppcVar4;
              ppcVar4 = ppcVar4 + 4;
            } while (pcVar9 != (char *)0x0);
          }
          __stream = pFStack_78;
          *pcVar6 = '=';
          if (psVar8[lVar10].label == (char *)0x0) {
            iVar3 = 1;
            if (pFStack_78 != (FILE *)0x0) {
              fprintf(pFStack_78,"%sundefined option.\n",emsg);
              errline(n,0,(FILE *)__stream);
            }
          }
          else {
            oVar1 = psVar8[lVar10].type;
            dVar13 = 0.0;
            if (oVar1 - OPT_FLAG < 8) {
              pcVar6 = pcVar6 + 1;
              switch(oVar1) {
              default:
                if (pFStack_78 != (FILE *)0x0) {
                  fprintf(pFStack_78,"%soption requires an argument.\n",emsg);
                  errline(n,0,(FILE *)__stream);
                  dVar13 = 0.0;
                }
                break;
              case OPT_INT:
              case OPT_FINT:
                iVar3 = 0;
                uVar7 = strtol(pcVar6,&pcStack_80,0);
                pcVar6 = pcStack_80;
                if ((*pcStack_80 != '\0') && (iVar3 = 1, __stream != (FILE *)0x0)) {
                  fprintf(__stream,"%sillegal character in integer argument.\n",emsg);
                  errline(n,(int)pcVar6 - *(int *)(argv + lVar12),(FILE *)__stream);
                }
                pcVar6 = (char *)0x0;
                dVar13 = 0.0;
                goto LAB_00106137;
              case OPT_DBL:
              case OPT_FDBL:
                dVar13 = strtod(pcVar6,&pcStack_80);
                pcVar6 = pcStack_80;
                if (*pcStack_80 == '\0') goto LAB_00106132;
                if (__stream != (FILE *)0x0) {
                  dStack_70 = dVar13;
                  fprintf(__stream,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar6 - *(int *)(argv + lVar12),(FILE *)__stream);
                  dVar13 = dStack_70;
                }
                break;
              case OPT_STR:
              case OPT_FSTR:
                goto switchD_00105faa_caseD_4;
              }
              uVar7 = 0;
              iVar3 = 1;
              pcVar6 = (char *)0x0;
            }
            else {
LAB_00106132:
              pcVar6 = (char *)0x0;
switchD_00105faa_caseD_4:
              uVar7 = 0;
              iVar3 = 0;
            }
LAB_00106137:
            switch(op[lVar10].type) {
            case OPT_INT:
              *(int *)op[lVar10].arg = (int)uVar7;
              break;
            case OPT_DBL:
              *(double *)op[lVar10].arg = dVar13;
              break;
            case OPT_STR:
              *(char **)op[lVar10].arg = pcVar6;
              break;
            case OPT_FINT:
              (*(code *)op[lVar10].arg)(uVar7 & 0xffffffff);
              break;
            case OPT_FDBL:
              (*(code *)op[lVar10].arg)();
              break;
            case OPT_FSTR:
              (*(code *)op[lVar10].arg)(pcVar6);
            }
          }
          iVar11 = iVar3 + iVar11;
        }
      }
      pcVar6 = argv[lVar12 + 1];
      lVar12 = lVar12 + 1;
    } while (pcVar6 != (char *)0x0);
    if (0 < iVar11) {
      fprintf(__stream,"Valid command line options for \"%s\" are:\n",*ppcStack_68);
      OptPrint();
      exit(1);
    }
  }
  return;
}

Assistant:

static void handle_D_option(char *z){
  char **paz;
  nDefine++;
  azDefine = (char **) realloc(azDefine, sizeof(azDefine[0])*nDefine);
  if( azDefine==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  paz = &azDefine[nDefine-1];
  *paz = (char *) malloc( lemonStrlen(z)+1 );
  if( *paz==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  strcpy(*paz, z);
  for(z=*paz; *z && *z!='='; z++){}
  *z = 0;
}